

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O0

void __thiscall mocker::nasm::Extern::~Extern(Extern *this)

{
  Extern *this_local;
  
  ~Extern(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Extern(std::string identifier) : identifier(std::move(identifier)) {}